

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.h
# Opt level: O2

void __thiscall WangLandauSampler::markov_step(WangLandauSampler *this)

{
  FixedDegreeProposer *this_00;
  uint uVar1;
  Network *network;
  pointer pdVar2;
  Histogram<unsigned_int> *pHVar3;
  ulong uVar4;
  uint uVar5;
  Random *this_01;
  longdouble in_ST0;
  double dVar6;
  GeneratedProposal proposal;
  
  network = (this->super_UniformSampler).network;
  uVar5 = network->total_triangles;
  this_00 = &(this->super_UniformSampler).proposer;
  FixedDegreeProposer::generate_proposal(&proposal,this_00,network);
  this_01 = (Random *)(this->super_UniformSampler).network;
  FixedDegreeProposer::propose(this_00,(Network *)this_01,&proposal);
  uVar1 = ((this->super_UniformSampler).network)->total_triangles;
  Random::R((longdouble *)(this->super_UniformSampler).super_Sampler.rng,this_01);
  pdVar2 = (this->entropy).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar6 = exp(pdVar2[(ulong)uVar5 / 3] - pdVar2[(ulong)uVar1 / 3]);
  if ((longdouble)dVar6 < in_ST0) {
    FixedDegreeProposer::rollback(this_00,(this->super_UniformSampler).network,&proposal);
  }
  pHVar3 = (this->super_UniformSampler).super_Sampler.histogram;
  uVar4 = (ulong)((this->super_UniformSampler).network)->total_triangles;
  (*pHVar3->_vptr_Histogram[3])(pHVar3,uVar4 / 3,uVar4 % 3);
  dVar6 = this->f;
  uVar5 = Histogram<unsigned_int>::bin
                    ((this->super_UniformSampler).super_Sampler.histogram,
                     ((this->super_UniformSampler).network)->total_triangles / 3);
  pdVar2 = (this->entropy).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[uVar5] = dVar6 + pdVar2[uVar5];
  return;
}

Assistant:

void markov_step() {
        unsigned int old_triangles = network.get_triangles();

        GeneratedProposal proposal = proposer.generate_proposal(network);
        proposer.propose(network, proposal);

        unsigned int new_triangles = network.get_triangles();

        bool was_accepted = true;
        // if rejected
        if (rng.R() > exp(entropy[old_triangles] - entropy[new_triangles])) {
            proposer.rollback(network, proposal);
            was_accepted = false;
        }

        histogram.add(network.get_triangles());
        entropy[histogram.bin(network.get_triangles())] += f;
    }